

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_date_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue obj;
  JSValue ctor;
  JSValue v_01;
  JSValue this_val;
  JSValue v_02;
  JSValue this_val_00;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  undefined8 in_RDI;
  JSContext *in_R8;
  double dVar5;
  JSValue JVar6;
  JSValue s;
  double fields [7];
  JSObject *p;
  JSValue dv;
  JSValue v;
  double val;
  double a;
  int n;
  int i;
  JSValue rv;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val_1;
  JSValue v_1;
  double in_stack_fffffffffffffe68;
  JSContext *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  JSValueUnion in_stack_fffffffffffffe80;
  JSValueUnion in_stack_fffffffffffffe88;
  JSValueUnion argv_00;
  JSValueUnion in_stack_fffffffffffffe90;
  JSValueUnion in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffea0;
  undefined4 uVar7;
  int in_stack_fffffffffffffeac;
  undefined4 uVar8;
  double *in_stack_fffffffffffffeb0;
  double local_148 [4];
  int in_stack_fffffffffffffedc;
  JSContext *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  JSContext *local_b8;
  double local_b0;
  int local_a8;
  int in_stack_ffffffffffffff5c;
  undefined4 local_98;
  int argc_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar9;
  int argc_01;
  undefined4 in_stack_ffffffffffffff98;
  int32_t iVar10;
  undefined4 in_stack_ffffffffffffff9c;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 uStack_44;
  JSValueUnion local_10;
  int64_t local_8;
  
  uVar9 = (undefined4)in_RDI;
  argc_01 = (int)((ulong)in_RDI >> 0x20);
  JVar6.tag = in_RDX;
  JVar6.u.ptr = in_RSI.ptr;
  iVar2 = JS_IsUndefined(JVar6);
  local_a8 = in_ECX;
  if (iVar2 != 0) {
    local_a8 = 0;
  }
  if (local_a8 == 0) {
    iVar4 = date_now();
    local_b8 = (JSContext *)(double)iVar4;
    iVar2 = local_a8;
  }
  else {
    iVar2 = local_a8;
    if (local_a8 == 1) {
      if ((((int)(in_R8->header).link.prev == -1) && (*(short *)(*(long *)&in_R8->header + 6) == 10)
          ) && (iVar3 = JS_IsNumber(*(JSValue *)(*(long *)&in_R8->header + 0x30)), iVar2 = local_a8,
               iVar3 != 0)) {
        val_04.tag = in_stack_fffffffffffffea0;
        val_04.u.ptr = in_stack_fffffffffffffe98.ptr;
        iVar2 = JS_ToFloat64((JSContext *)in_stack_fffffffffffffe90.ptr,
                             (double *)in_stack_fffffffffffffe88.ptr,val_04);
        if (iVar2 != 0) {
          iVar10 = 0;
          local_60 = 6;
          goto LAB_0014dcc8;
        }
        local_b8 = (JSContext *)time_clip(in_stack_fffffffffffffe68);
        iVar2 = local_a8;
      }
      else {
        val_02.tag = (int64_t)in_stack_fffffffffffffe90.ptr;
        val_02.u.ptr = in_stack_fffffffffffffe88.ptr;
        JVar6 = JS_ToPrimitive((JSContext *)in_stack_fffffffffffffe80.ptr,val_02,
                               in_stack_fffffffffffffe7c);
        iVar3 = JS_IsString(JVar6);
        if (iVar3 == 0) {
          val_01.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
          val_01.u.ptr = in_stack_fffffffffffffe80.ptr;
          iVar3 = JS_ToFloat64Free((JSContext *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                   (double *)in_stack_fffffffffffffe70,val_01);
          if (iVar3 != 0) {
            iVar10 = 0;
            local_60 = 6;
            goto LAB_0014dcc8;
          }
        }
        else {
          in_stack_fffffffffffffef0 = 0;
          this_val_00.tag._0_4_ = in_stack_ffffffffffffff98;
          this_val_00.u = (JSValueUnion)in_RDX;
          this_val_00.tag._4_4_ = in_stack_ffffffffffffff9c;
          JVar6 = js_Date_parse((JSContext *)in_RSI.ptr,this_val_00,argc_01,
                                (JSValue *)CONCAT44(iVar2,in_stack_ffffffffffffff78));
          v_00.u._4_4_ = in_stack_fffffffffffffe7c;
          v_00.u.int32 = in_stack_fffffffffffffe78;
          v_00.tag = (int64_t)in_stack_fffffffffffffe80.ptr;
          JS_FreeValue(in_stack_fffffffffffffe70,v_00);
          iVar3 = JS_IsException(JVar6);
          if (iVar3 != 0) {
            iVar10 = 0;
            local_60 = 6;
            goto LAB_0014dcc8;
          }
          val_00.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
          val_00.u.ptr = in_stack_fffffffffffffe80.ptr;
          iVar3 = JS_ToFloat64Free((JSContext *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                   (double *)in_stack_fffffffffffffe70,val_00);
          if (iVar3 != 0) {
            iVar10 = 0;
            local_60 = 6;
            goto LAB_0014dcc8;
          }
        }
        local_b8 = (JSContext *)time_clip(in_stack_fffffffffffffe68);
      }
    }
    else {
      memset(local_148,0,0x38);
      local_148[2] = 1.0;
      if (7 < local_a8) {
        local_a8 = 7;
      }
      for (in_stack_ffffffffffffff5c = 0; in_stack_ffffffffffffff5c < local_a8;
          in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
        val_05.tag = in_stack_fffffffffffffea0;
        val_05.u.ptr = in_stack_fffffffffffffe98.ptr;
        iVar3 = JS_ToFloat64((JSContext *)in_stack_fffffffffffffe90.ptr,
                             (double *)in_stack_fffffffffffffe88.ptr,val_05);
        if (iVar3 != 0) {
          iVar10 = 0;
          local_60 = 6;
          goto LAB_0014dcc8;
        }
        if (0x7fefffffffffffff < (ulong)ABS(local_b0)) break;
        dVar5 = trunc(local_b0);
        local_148[in_stack_ffffffffffffff5c] = dVar5;
        if (((in_stack_ffffffffffffff5c == 0) && (0.0 <= local_148[0])) && (local_148[0] < 100.0)) {
          local_148[0] = local_148[0] + 1900.0;
        }
      }
      if (in_stack_ffffffffffffff5c == local_a8) {
        in_stack_fffffffffffffe70 =
             (JSContext *)set_date_fields(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        local_b8 = in_stack_fffffffffffffe70;
      }
      else {
        in_stack_fffffffffffffe70 = (JSContext *)0x7ff8000000000000;
        local_b8 = in_stack_fffffffffffffe70;
      }
    }
  }
  ctor.tag._0_4_ = in_stack_fffffffffffffef0;
  ctor.u = (JSValueUnion)in_stack_fffffffffffffee8;
  ctor.tag._4_4_ = in_stack_fffffffffffffef4;
  JVar6 = js_create_from_ctor(in_stack_fffffffffffffee0,ctor,in_stack_fffffffffffffedc);
  uVar7 = JVar6.u._0_4_;
  uVar8 = JVar6.u._4_4_;
  argv_00 = JVar6.u;
  local_98 = (undefined4)JVar6.tag;
  argc_00 = JVar6.tag._4_4_;
  iVar3 = JS_IsException(JVar6);
  if (iVar3 == 0) {
    if (local_b8 == (JSContext *)(double)(int)(double)local_b8) {
      local_10._4_4_ = uStack_44;
      local_10.int32 = (int)(double)local_b8;
      local_8 = 0;
    }
    else {
      JVar6 = __JS_NewFloat64((JSContext *)CONCAT44(argc_01,uVar9),(double)local_b8);
      local_58 = JVar6.u;
      local_10 = local_58;
      local_50 = JVar6.tag;
      local_8 = local_50;
    }
    obj.tag._0_4_ = uVar7;
    obj.u.float64 = (double)local_8;
    obj.tag._4_4_ = uVar8;
    val_03.tag = (int64_t)local_10.ptr;
    val_03.u.float64 = in_stack_fffffffffffffe90.float64;
    JS_SetObjectData((JSContext *)in_stack_fffffffffffffe88.ptr,obj,val_03);
  }
  v_01.tag._0_4_ = local_98;
  v_01.u.float64 = argv_00.float64;
  v_01.tag._4_4_ = argc_00;
  iVar3 = JS_IsException(v_01);
  if ((iVar3 == 0) &&
     (v_02.tag = in_RDX, v_02.u.float64 = in_RSI.float64, iVar3 = JS_IsUndefined(v_02), iVar3 != 0))
  {
    this_val.u._4_4_ = iVar2;
    this_val.u.int32 = in_stack_ffffffffffffff78;
    this_val.tag._0_4_ = uVar9;
    this_val.tag._4_4_ = argc_01;
    JVar6 = get_date_string(in_R8,this_val,argc_00,(JSValue *)argv_00.ptr,in_stack_ffffffffffffff5c)
    ;
    iVar4 = JVar6.tag;
    argv_00 = JVar6.u;
    JS_FreeValue(in_stack_fffffffffffffe70,JVar6);
    local_98 = (undefined4)iVar4;
    argc_00 = (int)((ulong)iVar4 >> 0x20);
  }
  iVar10 = argv_00.int32;
  in_stack_ffffffffffffff9c = argv_00._4_4_;
  local_60 = CONCAT44(argc_00,local_98);
LAB_0014dcc8:
  JVar1.u._4_4_ = in_stack_ffffffffffffff9c;
  JVar1.u.int32 = iVar10;
  JVar1.tag = local_60;
  return JVar1;
}

Assistant:

static JSValue js_date_constructor(JSContext *ctx, JSValueConst new_target,
                                   int argc, JSValueConst *argv)
{
    // Date(y, mon, d, h, m, s, ms)
    JSValue rv;
    int i, n;
    double a, val;

    if (JS_IsUndefined(new_target)) {
        /* invoked as function */
        argc = 0;
    }
    n = argc;
    if (n == 0) {
        val = date_now();
    } else if (n == 1) {
        JSValue v, dv;
        if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
            JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
            if (p->class_id == JS_CLASS_DATE && JS_IsNumber(p->u.object_data)) {
                if (JS_ToFloat64(ctx, &val, p->u.object_data))
                    return JS_EXCEPTION;
                val = time_clip(val);
                goto has_val;
            }
        }
        v = JS_ToPrimitive(ctx, argv[0], HINT_NONE);
        if (JS_IsString(v)) {
            dv = js_Date_parse(ctx, JS_UNDEFINED, 1, (JSValueConst *)&v);
            JS_FreeValue(ctx, v);
            if (JS_IsException(dv))
                return JS_EXCEPTION;
            if (JS_ToFloat64Free(ctx, &val, dv))
                return JS_EXCEPTION;
        } else {
            if (JS_ToFloat64Free(ctx, &val, v))
                return JS_EXCEPTION;
        }
        val = time_clip(val);
    } else {
        double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
        if (n > 7)
            n = 7;
        for(i = 0; i < n; i++) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isfinite(a))
                break;
            fields[i] = trunc(a);
            if (i == 0 && fields[0] >= 0 && fields[0] < 100)
                fields[0] += 1900;
        }
        val = (i == n) ? set_date_fields(fields, 1) : NAN;
    }
has_val:
#if 0
    JSValueConst args[3];
    args[0] = new_target;
    args[1] = ctx->class_proto[JS_CLASS_DATE];
    args[2] = JS_NewFloat64(ctx, val);
    rv = js___date_create(ctx, JS_UNDEFINED, 3, args);
#else
    rv = js_create_from_ctor(ctx, new_target, JS_CLASS_DATE);
    if (!JS_IsException(rv))
        JS_SetObjectData(ctx, rv, JS_NewFloat64(ctx, val));
#endif
    if (!JS_IsException(rv) && JS_IsUndefined(new_target)) {
        /* invoked as a function, return (new Date()).toString(); */
        JSValue s;
        s = get_date_string(ctx, rv, 0, NULL, 0x13);
        JS_FreeValue(ctx, rv);
        rv = s;
    }
    return rv;
}